

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void SstWriterClose(SstStream Stream)

{
  char *__ptr;
  size_t sVar1;
  void *__ptr_00;
  SstStream in_RDI;
  SstStream in_stack_00000010;
  _ReturnMetadataInfo ReleaseData;
  int i;
  char tmp [30];
  char *StringList;
  CPTimestepList List;
  StepRequest Request;
  timeval Diff;
  timeval CloseTime;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ReturnMetadataInfo in_stack_ffffffffffffff08;
  SstStream in_stack_ffffffffffffff10;
  SstStream in_stack_ffffffffffffff20;
  SMPI_Comm in_stack_ffffffffffffff30;
  int local_a0;
  uint local_6c;
  char local_68 [40];
  char *local_40;
  CPTimestepList local_38;
  StepRequest local_30;
  long local_28;
  undefined4 local_18;
  undefined4 in_stack_ffffffffffffffec;
  long in_stack_fffffffffffffff0;
  
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  in_RDI->CloseTimestepCount = in_RDI->WriterTimestep;
  if ((in_RDI->ConfigParams->StepDistributionMode != 2) ||
     (in_RDI->LastDemandTimestep == in_RDI->CloseTimestepCount)) {
    SendCloseMsgs((SstStream)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  UntagPreciousTimesteps((SstStream)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  in_RDI->ConfigParams->ReserveQueueLimit = 0;
  QueueMaintenance(in_stack_ffffffffffffff20);
  usleep(100000);
  if ((in_RDI->ConfigParams->CPCommPattern == 1) || (in_RDI->Rank == 0)) {
    if (0 < in_RDI->ReleaseCount) {
      if (in_RDI->ConfigParams->CPCommPattern == 0) {
        SMPI_Bcast(ReleaseData.ReaderStatus,ReleaseData._100_4_,ReleaseData.LockDefnsCount,
                   ReleaseData.LockDefnsList._4_4_,(SMPI_Comm)ReleaseData._80_8_);
        SMPI_Bcast(ReleaseData.ReaderStatus,ReleaseData._100_4_,ReleaseData.LockDefnsCount,
                   ReleaseData.LockDefnsList._4_4_,(SMPI_Comm)ReleaseData._80_8_);
      }
      in_RDI->ReleaseCount = 0;
      free(in_RDI->ReleaseList);
      in_RDI->ReleaseList = (_ReleaseRec *)0x0;
    }
    while (in_RDI->StepRequestQueue != (StepRequest)0x0) {
      local_30 = in_RDI->StepRequestQueue;
      in_RDI->StepRequestQueue = local_30->Next;
      free(local_30);
    }
    while (in_RDI->QueuedTimesteps != (CPTimestepList)0x0) {
      CP_verbose(in_RDI,PerStepVerbose,"Waiting for timesteps to be released in WriterClose\n");
      if (4 < in_RDI->CPVerbosityLevel) {
        local_38 = in_RDI->QueuedTimesteps;
        local_40 = (char *)malloc(1);
        *local_40 = '\0';
        for (; local_38 != (CPTimestepList)0x0; local_38 = local_38->Next) {
          in_stack_ffffffffffffff00 = in_RDI->QueuedTimestepCount;
          CP_verbose(in_RDI,TraceVerbose,
                     "IN TS WAIT, ENTRIES are Timestep %ld (exp %d, Prec %d, Ref %d), Count now %d\n"
                     ,local_38->Timestep,(ulong)(uint)local_38->Expired,
                     (ulong)(uint)local_38->PreciousTimestep,local_38->ReferenceCount);
          snprintf(local_68,0x1e,"%zd ",local_38->Timestep);
          __ptr = local_40;
          in_stack_ffffffffffffff10 = (SstStream)strlen(local_40);
          sVar1 = strlen(local_68);
          local_40 = (char *)realloc(__ptr,(long)&in_stack_ffffffffffffff10->CPInfo + sVar1 + 1);
          strcat(local_40,local_68);
        }
        CP_verbose(in_RDI,TraceVerbose,"The timesteps still queued are: %s\n",local_40);
        free(local_40);
      }
      CP_verbose(in_RDI,TraceVerbose,"Reader Count is %d\n",(ulong)(uint)in_RDI->ReaderCount);
      for (local_6c = 0; (int)local_6c < in_RDI->ReaderCount; local_6c = local_6c + 1) {
        CP_verbose(in_RDI,TraceVerbose,"Reader [%d] status is %s\n",(ulong)local_6c,
                   SSTStreamStatusStr[in_RDI->Readers[(int)local_6c]->ReaderStatus]);
      }
      pthread_cond_wait((pthread_cond_t *)&in_RDI->DataCondition,
                        (pthread_mutex_t *)&in_RDI->DataLock);
      if ((in_RDI->ConfigParams->CPCommPattern == 0) &&
         (SMPI_Bcast(ReleaseData.ReaderStatus,ReleaseData._100_4_,ReleaseData.LockDefnsCount,
                     ReleaseData.LockDefnsList._4_4_,(SMPI_Comm)ReleaseData._80_8_),
         0 < in_RDI->ReleaseCount)) {
        SMPI_Bcast(ReleaseData.ReaderStatus,ReleaseData._100_4_,ReleaseData.LockDefnsCount,
                   ReleaseData.LockDefnsList._4_4_,(SMPI_Comm)ReleaseData._80_8_);
        in_RDI->ReleaseCount = 0;
        free(in_RDI->ReleaseList);
        in_RDI->ReleaseList = (_ReleaseRec *)0x0;
      }
    }
    if (in_RDI->ConfigParams->CPCommPattern == 0) {
      in_RDI->ReleaseCount = -1;
      SMPI_Bcast(ReleaseData.ReaderStatus,ReleaseData._100_4_,ReleaseData.LockDefnsCount,
                 ReleaseData.LockDefnsList._4_4_,(SMPI_Comm)ReleaseData._80_8_);
      in_RDI->ReleaseCount = 0;
    }
  }
  if (in_RDI->ConfigParams->CPCommPattern == 0) {
    if (in_RDI->Rank != 0) {
      while (SMPI_Bcast(ReleaseData.ReaderStatus,ReleaseData._100_4_,ReleaseData.LockDefnsCount,
                        ReleaseData.LockDefnsList._4_4_,(SMPI_Comm)ReleaseData._80_8_),
            local_a0 != -1) {
        if (0 < local_a0) {
          __ptr_00 = malloc((long)local_a0 << 4);
          SMPI_Bcast(ReleaseData.ReaderStatus,ReleaseData._100_4_,ReleaseData.LockDefnsCount,
                     ReleaseData.LockDefnsList._4_4_,(SMPI_Comm)ReleaseData._80_8_);
          pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
          ProcessReleaseList(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
          free(__ptr_00);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
    SMPI_Barrier(in_stack_ffffffffffffff30);
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  gettimeofday((timeval *)&local_18,(__timezone_ptr_t)0x0);
  local_28 = CONCAT44(in_stack_ffffffffffffffec,local_18) - (in_RDI->ValidStartTime).tv_sec;
  in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 - (in_RDI->ValidStartTime).tv_usec;
  if (in_stack_fffffffffffffff0 < 0) {
    local_28 = local_28 + -1;
    in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1000000;
  }
  (in_RDI->Stats).StreamValidTimeSecs =
       (double)in_stack_fffffffffffffff0 / 1000000.0 + (double)local_28;
  if (1 < in_RDI->CPVerbosityLevel) {
    DoStreamSummary(in_stack_00000010);
  }
  CP_verbose(in_RDI,PerStepVerbose,"All timesteps are released in WriterClose\n");
  if (in_RDI->Rank == 0) {
    removeContactInfo((SstStream)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  return;
}

Assistant:

void SstWriterClose(SstStream Stream)
{
    struct timeval CloseTime, Diff;
    STREAM_MUTEX_LOCK(Stream);
    Stream->CloseTimestepCount = Stream->WriterTimestep;
    if ((Stream->ConfigParams->StepDistributionMode != StepsOnDemand) ||
        (Stream->LastDemandTimestep == Stream->CloseTimestepCount))
    {
        /* send if not OnDemand, or if all timesteps have been send OnDemand */
        SendCloseMsgs(Stream);
    }
    UntagPreciousTimesteps(Stream);
    Stream->ConfigParams->ReserveQueueLimit = 0;
    QueueMaintenance(Stream);

    // sleep briefly to allow for outgoing close messages to arrive
    usleep(100 * 1000);

    if ((Stream->ConfigParams->CPCommPattern == SstCPCommPeer) || (Stream->Rank == 0))
    {
        if (Stream->ReleaseCount > 0)
        {
            if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
            {
                SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                SMPI_Bcast(Stream->ReleaseList,
                           Stream->ReleaseCount * sizeof(*(Stream->ReleaseList)), SMPI_BYTE, 0,
                           Stream->mpiComm);
            }
            Stream->ReleaseCount = 0;
            free(Stream->ReleaseList);
            Stream->ReleaseList = NULL;
        }
        while (Stream->StepRequestQueue)
        {
            StepRequest Request = Stream->StepRequestQueue;
            Stream->StepRequestQueue = Request->Next;
            free(Request);
        }
        while (Stream->QueuedTimesteps)
        {
            CP_verbose(Stream, PerStepVerbose,
                       "Waiting for timesteps to be released in WriterClose\n");
            if (Stream->CPVerbosityLevel >= TraceVerbose)
            {
                CPTimestepList List = Stream->QueuedTimesteps;
                char *StringList = malloc(1);
                StringList[0] = 0;

                while (List)
                {
                    char tmp[30];
                    CP_verbose(Stream, TraceVerbose,
                               "IN TS WAIT, ENTRIES are Timestep %ld (exp %d, "
                               "Prec %d, Ref %d), Count now %d\n",
                               List->Timestep, List->Expired, List->PreciousTimestep,
                               List->ReferenceCount, Stream->QueuedTimestepCount);
                    snprintf(tmp, sizeof(tmp), "%zd ", List->Timestep);
                    StringList = realloc(StringList, strlen(StringList) + strlen(tmp) + 1);
                    strcat(StringList, tmp);
                    List = List->Next;
                }
                CP_verbose(Stream, TraceVerbose, "The timesteps still queued are: %s\n",
                           StringList);
                free(StringList);
            }
            CP_verbose(Stream, TraceVerbose, "Reader Count is %d\n", Stream->ReaderCount);
            for (int i = 0; i < Stream->ReaderCount; i++)
            {
                CP_verbose(Stream, TraceVerbose, "Reader [%d] status is %s\n", i,
                           SSTStreamStatusStr[Stream->Readers[i]->ReaderStatus]);
            }
            /* NEED TO HANDLE FAILURE HERE */
            STREAM_CONDITION_WAIT(Stream);
            if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
            {
                SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                if (Stream->ReleaseCount > 0)
                {
                    SMPI_Bcast(Stream->ReleaseList,
                               Stream->ReleaseCount * sizeof(*(Stream->ReleaseList)), SMPI_BYTE, 0,
                               Stream->mpiComm);
                    Stream->ReleaseCount = 0;
                    free(Stream->ReleaseList);
                    Stream->ReleaseList = NULL;
                }
            }
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
        {
            Stream->ReleaseCount = -1;
            SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
            Stream->ReleaseCount = 0;
        }
    }

    if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
    {
        if (Stream->Rank != 0)
        {
            struct _ReturnMetadataInfo ReleaseData;
            while (1)
            {
                SMPI_Bcast(&ReleaseData.ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                if (ReleaseData.ReleaseCount == -1)
                {
                    break;
                }
                else if (ReleaseData.ReleaseCount > 0)
                {
                    ReleaseData.ReleaseList =
                        malloc(ReleaseData.ReleaseCount * sizeof(*ReleaseData.ReleaseList));
                    SMPI_Bcast(ReleaseData.ReleaseList,
                               ReleaseData.ReleaseCount * sizeof(*ReleaseData.ReleaseList),
                               SMPI_BYTE, 0, Stream->mpiComm);
                    STREAM_MUTEX_UNLOCK(Stream);
                    ProcessReleaseList(Stream, &ReleaseData);
                    STREAM_MUTEX_LOCK(Stream);
                    free(ReleaseData.ReleaseList);
                    ReleaseData.ReleaseList = NULL;
                }
            }
        }
        /*
         * if we're CommMin, getting here implies that Rank 0 has released all
         * timesteps, other ranks can follow suit after barrier
         */
        STREAM_MUTEX_UNLOCK(Stream);
        SMPI_Barrier(Stream->mpiComm);
        STREAM_MUTEX_LOCK(Stream);
    }
    STREAM_MUTEX_UNLOCK(Stream);
    gettimeofday(&CloseTime, NULL);
    timersub(&CloseTime, &Stream->ValidStartTime, &Diff);
    Stream->Stats.StreamValidTimeSecs = (double)Diff.tv_usec / 1e6 + Diff.tv_sec;

    if (Stream->CPVerbosityLevel >= (int)SummaryVerbose)
    {
        DoStreamSummary(Stream);
    }
    CP_verbose(Stream, PerStepVerbose, "All timesteps are released in WriterClose\n");

    /*
     *  Only rank 0 removes contact info, and only when everything is closed.
     */
    if (Stream->Rank == 0)
    {
        removeContactInfo(Stream);
    }
}